

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O2

void InitTestEngine(TestFailEventListener listener)

{
  testing_fails = 0;
  setvbuf(_stdout,(char *)0x0,2,0);
  setvbuf(_stderr,(char *)0x0,2,0);
  fail_listener_ = listener;
  return;
}

Assistant:

void InitTestEngine(TestFailEventListener listener)
  {
  testing_fails = 0;
  // Disable stdout buffering to prevent information lost on assertion or core
  // dump.
  setvbuf(stdout, NULL, _IONBF, 0);
  setvbuf(stderr, NULL, _IONBF, 0);

#ifdef _MSC_VER
  // By default, send all reports to STDOUT to prevent CI hangs.
  // Enable assert report box [Abort|Retry|Ignore] if a debugger is present.
  const int dbg_mode = (_CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG) |
    (IsDebuggerPresent() ? _CRTDBG_MODE_WNDW : 0);
  (void)dbg_mode; // release mode fix
  // CrtDebug reports to _CRT_WARN channel.
  _CrtSetReportMode(_CRT_WARN, dbg_mode);
  _CrtSetReportFile(_CRT_WARN, _CRTDBG_FILE_STDOUT);
  // The assert from <assert.h> reports to _CRT_ERROR channel
  _CrtSetReportMode(_CRT_ERROR, dbg_mode);
  _CrtSetReportFile(_CRT_ERROR, _CRTDBG_FILE_STDOUT);
  // Internal CRT assert channel?
  _CrtSetReportMode(_CRT_ASSERT, dbg_mode);
  _CrtSetReportFile(_CRT_ASSERT, _CRTDBG_FILE_STDOUT);
#endif

  // clang-format off

#if defined(MEMORY_LEAK_TRACKING_MSVC)
  // For more thorough checking:
  // _CRTDBG_DELAY_FREE_MEM_DF | _CRTDBG_CHECK_ALWAYS_DF
  auto flags = _CrtSetDbgFlag(_CRTDBG_REPORT_FLAG);
  _CrtSetDbgFlag(flags | _CRTDBG_ALLOC_MEM_DF);
#endif

  // clang-format on

  fail_listener_ = listener;
  }